

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CwiseBinaryOp.h
# Opt level: O3

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>,3,0>
       ::
       run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                 (redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *eval,scalar_sum_op<double,_double> *func,
                 CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                 *xpr)

{
  ulong uVar1;
  double *pdVar2;
  double *pdVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  double dVar7;
  Scalar SVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  uVar1 = (xpr->m_rhs->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows;
  uVar6 = uVar1 + 3;
  if (-1 < (long)uVar1) {
    uVar6 = uVar1;
  }
  pdVar2 = (eval->
           super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           ).
           super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
           .m_d.lhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.
           data;
  if (uVar1 + 1 < 3) {
    return *pdVar2 * *(eval->
                      super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      ).
                      super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                      .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                      .m_d.data;
  }
  uVar4 = uVar1 - ((long)uVar1 >> 0x3f) & 0xfffffffffffffffe;
  pdVar3 = (eval->
           super_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           ).
           super_binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
           .m_d.rhsImpl.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.
           data;
  dVar10 = *pdVar2 * *pdVar3;
  dVar11 = pdVar2[1] * pdVar3[1];
  if (3 < (long)uVar1) {
    uVar6 = uVar6 & 0xfffffffffffffffc;
    dVar7 = pdVar2[2] * pdVar3[2];
    dVar9 = pdVar2[3] * pdVar3[3];
    if (7 < uVar1) {
      lVar5 = 4;
      do {
        dVar10 = dVar10 + pdVar2[lVar5] * pdVar3[lVar5];
        dVar11 = dVar11 + (pdVar2 + lVar5)[1] * (pdVar3 + lVar5)[1];
        dVar7 = dVar7 + (pdVar2 + 2)[lVar5] * (pdVar3 + 2)[lVar5];
        dVar9 = dVar9 + (pdVar2 + 2 + lVar5)[1] * (pdVar3 + 2 + lVar5)[1];
        lVar5 = lVar5 + 4;
      } while (lVar5 < (long)uVar6);
    }
    dVar10 = dVar7 + dVar10;
    dVar11 = dVar9 + dVar11;
    if ((long)uVar6 < (long)uVar4) {
      dVar10 = dVar10 + pdVar2[uVar6] * pdVar3[uVar6];
      dVar11 = dVar11 + (pdVar2 + uVar6)[1] * (pdVar3 + uVar6)[1];
    }
  }
  SVar8 = dVar11 + dVar10;
  if ((long)uVar4 < (long)uVar1) {
    do {
      SVar8 = SVar8 + pdVar2[uVar4] * pdVar3[uVar4];
      uVar4 = uVar4 + 1;
    } while (uVar1 != uVar4);
  }
  return SVar8;
}

Assistant:

EIGEN_CONSTEXPR
    Index rows() const EIGEN_NOEXCEPT {
      // return the fixed size type if available to enable compile time optimizations
      return internal::traits<typename internal::remove_all<LhsNested>::type>::RowsAtCompileTime==Dynamic ? m_rhs.rows() : m_lhs.rows();
    }